

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

string * __thiscall
chrono::ChValueSpecific<Eigen::Matrix<double,-1,-1,1,-1,-1>>::GetClassRegisteredName_abi_cxx11_
          (ChValueSpecific<Eigen::Matrix<double,_1,_1,1,_1,_1>> *this)

{
  int iVar1;
  ChException *anon_var_0;
  allocator local_19;
  ChValueSpecific<Eigen::Matrix<double,_1,_1,1,_1,_1>> *local_18;
  ChValueSpecific<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *this_local;
  
  local_18 = this;
  if (GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_,"",&local_19);
      std::allocator<char>::~allocator((allocator<char> *)&local_19);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_);
    }
  }
  if (*(long *)(this + 0x30) == 0) {
    this_local = (ChValueSpecific<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
                 &GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_;
  }
  else {
    this_local = (ChValueSpecific<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
                 ChClassFactory::GetClassTagName_abi_cxx11_
                           ((type_info *)&Eigen::Matrix<double,-1,-1,1,-1,-1>::typeinfo);
  }
  return (string *)this_local;
}

Assistant:

virtual std::string& GetClassRegisteredName() {
          static std::string nostring("");
          if (!_ptr_to_val) {
              return nostring;
          }
          try {
              return ChClassFactory::GetClassTagName(typeid(*_ptr_to_val));
          }catch (const ChException &) {
              return nostring;
          }
        }